

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::IfStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,IfStatement *this,int level)

{
  pointer puVar1;
  IfCase *pIVar2;
  Block *pBVar3;
  string *psVar4;
  ostream *poVar5;
  unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_> *c;
  pointer puVar6;
  char cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string *local_1c8;
  long local_1c0;
  stringstream s;
  ostream local_1a8 [376];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)level);
  std::operator+(&bStack_208,&local_1e8,"IfStatement {");
  local_1c0 = (long)level;
  poVar5 = std::operator<<(local_1a8,(string *)&bStack_208);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&bStack_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  puVar1 = (this->cases).
           super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->cases).
                super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    pIVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::IfCase_*,_std::default_delete<ninx::parser::element::IfCase>_>
             .super__Head_base<0UL,_ninx::parser::element::IfCase_*,_false>._M_head_impl;
    (**(code **)((long)(pIVar2->super_ASTElement)._vptr_ASTElement + 0x18))
              (&bStack_208,pIVar2,level + 1);
    poVar5 = std::operator<<(local_1a8,(string *)&bStack_208);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&bStack_208);
  }
  cVar7 = (char)local_1c0;
  if ((this->else_body)._M_t.
      super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
      .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl != (Block *)0x0) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar7);
    std::operator+(&bStack_208,&local_1e8,"} Else {");
    poVar5 = std::operator<<(local_1a8,(string *)&bStack_208);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&bStack_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    pBVar3 = (this->else_body)._M_t.
             super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
             .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
    (**(code **)(*(long *)&(pBVar3->super_Expression).super_Statement + 0x18))
              (&bStack_208,pBVar3,level + 1);
    poVar5 = std::operator<<(local_1a8,(string *)&bStack_208);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&bStack_208);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar7);
  std::operator+(&bStack_208,&local_1e8,"}");
  psVar4 = local_1c8;
  poVar5 = std::operator<<(local_1a8,(string *)&bStack_208);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&bStack_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return psVar4;
}

Assistant:

std::string ninx::parser::element::IfStatement::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "IfStatement {" << std::endl;
    for (auto& c : cases) {
        s << c->dump(level+1) << std::endl;
    }
    if (this->else_body) {
        s << std::string(level, '\t') + "} Else {" << std::endl;
        s << this->else_body->dump(level+1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}